

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::DynamicMessageTest_SpaceUsed_Test::
~DynamicMessageTest_SpaceUsed_Test(DynamicMessageTest_SpaceUsed_Test *this)

{
  DynamicMessageTest::~DynamicMessageTest(&this->super_DynamicMessageTest);
  operator_delete(this,0x130);
  return;
}

Assistant:

TEST_P(DynamicMessageTest, SpaceUsed) {
  // Test that SpaceUsedLong() works properly

  // Since we share the implementation with generated messages, we don't need
  // to test very much here.  Just make sure it appears to be working.

  Arena arena;
  Message* message = prototype_->New(use_arena() ? &arena : nullptr);
  TestUtil::ReflectionTester reflection_tester(descriptor_);

  size_t initial_space_used = message->SpaceUsedLong();

  reflection_tester.SetAllFieldsViaReflection(message);
  EXPECT_LT(initial_space_used, message->SpaceUsedLong());

  if (!use_arena()) {
    delete message;
  }
}